

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O0

void PrintGraph(ExpressionGraphContext *ctx,ScopeData *scope,bool printImported)

{
  ScopeData *pSVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  TypeBase **ppTVar5;
  TypeClass *pTVar6;
  FunctionData **ppFVar7;
  VariableData **ppVVar8;
  char *pcVar9;
  AliasData **ppAVar10;
  ScopeData **ppSVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 uVar15;
  char *in_stack_fffffffffffffe90;
  bool local_105;
  ScopeData *data_4;
  undefined1 auStack_e8 [4];
  uint i_4;
  char *local_e0;
  undefined1 local_d1;
  AliasData *pAStack_d0;
  bool imported_3;
  AliasData *data_3;
  undefined1 auStack_c0 [4];
  uint i_3;
  char *local_b8;
  undefined1 local_a9;
  VariableData *pVStack_a8;
  bool imported_2;
  VariableData *data_2;
  undefined1 auStack_98 [4];
  uint i_2;
  char *local_90;
  undefined1 local_81;
  FunctionData *pFStack_80;
  bool imported_1;
  FunctionData *data_1;
  uint i_1;
  bool imported;
  TypeBase *data;
  NamespaceData *pNStack_60;
  uint i;
  NamespaceData *owner_2;
  TypeBase *owner_1;
  FunctionData *owner;
  char *type;
  ScopeData *pSStack_38;
  bool printImported_local;
  ScopeData *scope_local;
  ExpressionGraphContext *ctx_local;
  
  type._7_1_ = printImported;
  pSStack_38 = scope;
  scope_local = (ScopeData *)ctx;
  PrintIndent(ctx);
  owner = (FunctionData *)0x27b35c;
  switch(pSStack_38->type) {
  case SCOPE_EXPLICIT:
    owner = (FunctionData *)0x2864e4;
    break;
  case SCOPE_NAMESPACE:
    owner = (FunctionData *)anon_var_dwarf_4fd62;
    break;
  case SCOPE_FUNCTION:
    owner = (FunctionData *)anon_var_dwarf_4fd78;
    break;
  case SCOPE_TYPE:
    owner = (FunctionData *)anon_var_dwarf_4fd82;
    break;
  case SCOPE_LOOP:
    owner = (FunctionData *)anon_var_dwarf_4fd98;
    break;
  case SCOPE_TEMPORARY:
    owner = (FunctionData *)anon_var_dwarf_4fda2;
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionGraph.cpp"
                  ,0xf2,"void PrintGraph(ExpressionGraphContext &, ScopeData *, bool)");
  }
  owner_1 = (TypeBase *)pSStack_38->ownerFunction;
  uVar15 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  if ((FunctionData *)owner_1 == (FunctionData *)0x0) {
    owner_2 = (NamespaceData *)pSStack_38->ownerType;
    if (owner_2 == (NamespaceData *)0x0) {
      pNStack_60 = pSStack_38->ownerNamespace;
      if (pNStack_60 == (NamespaceData *)0x0) {
        Print((ExpressionGraphContext *)scope_local,"ScopeData(%s, {}: s%04x) @ 0x%x-0x%x {\n",owner
              ,(ulong)pSStack_38->uniqueId,pSStack_38->startOffset & 0xffffffff,
              pSStack_38->dataSize & 0xffffffff);
      }
      else {
        in_stack_fffffffffffffe88 = CONCAT44(uVar15,pSStack_38->uniqueId);
        Print((ExpressionGraphContext *)scope_local,"ScopeData(%s, {%.*s: n%04x}: s%04x){\n",owner,
              (ulong)(uint)((int)(pNStack_60->name).name.end - (int)(pNStack_60->name).name.begin),
              (pNStack_60->name).name.begin,(ulong)pNStack_60->uniqueId,in_stack_fffffffffffffe88);
      }
    }
    else {
      Print((ExpressionGraphContext *)scope_local,"ScopeData(%s, {%.*s}: s%04x){\n",owner,
            (ulong)(uint)((int)(owner_2->children).data -
                         (int)((InplaceStr *)&owner_2->parent)->begin),
            ((InplaceStr *)&owner_2->parent)->begin,(ulong)pSStack_38->uniqueId);
    }
  }
  else {
    in_stack_fffffffffffffe88 = CONCAT44(uVar15,pSStack_38->uniqueId);
    in_stack_fffffffffffffe90 =
         (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                          (int)pSStack_38->startOffset);
    Print((ExpressionGraphContext *)scope_local,
          "ScopeData(%s, {%.*s: f%04x}: s%04x) @ 0x%x-0x%x {\n",owner,
          (ulong)(uint)((int)(((FunctionData *)owner_1)->name->name).end -
                       (int)(((FunctionData *)owner_1)->name->name).begin),
          (((FunctionData *)owner_1)->name->name).begin,(ulong)((FunctionData *)owner_1)->uniqueId,
          in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,(int)pSStack_38->dataSize);
  }
  *(int *)&scope_local->ownerNamespace = *(int *)&scope_local->ownerNamespace + 1;
  bVar2 = SmallArray<TypeBase_*,_2U>::empty(&pSStack_38->types);
  if (!bVar2) {
    PrintEnterBlock((ExpressionGraphContext *)scope_local,"types");
    for (data._4_4_ = 0; uVar4 = data._4_4_,
        uVar3 = SmallArray<TypeBase_*,_2U>::size(&pSStack_38->types), uVar4 < uVar3;
        data._4_4_ = data._4_4_ + 1) {
      ppTVar5 = SmallArray<TypeBase_*,_2U>::operator[](&pSStack_38->types,data._4_4_);
      _i_1 = *ppTVar5;
      pTVar6 = getType<TypeClass>(_i_1);
      local_105 = false;
      if (pTVar6 != (TypeClass *)0x0) {
        pTVar6 = getType<TypeClass>(_i_1);
        local_105 = (pTVar6->super_TypeStruct).super_TypeBase.importModule != (ModuleData *)0x0;
      }
      data_1._7_1_ = local_105;
      if ((bool)(type._7_1_ & 1) == local_105) {
        PrintIndent((ExpressionGraphContext *)scope_local);
        if ((_i_1->isGeneric & 1U) == 0) {
          uVar15 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
          if (_i_1->importModule == (ModuleData *)0x0) {
            in_stack_fffffffffffffe90 = "";
            if ((_i_1->hasPointers & 1U) != 0) {
              in_stack_fffffffffffffe90 = " gc_check";
            }
            in_stack_fffffffffffffe88 = CONCAT44(uVar15,_i_1->padding);
            Print((ExpressionGraphContext *)scope_local,"%.*s: size(%d) align(%d) padding(%d)%s\n",
                  (ulong)(uint)((int)(_i_1->name).end - (int)(_i_1->name).begin),(_i_1->name).begin,
                  _i_1->size & 0xffffffff,(ulong)_i_1->alignment,in_stack_fffffffffffffe88,
                  in_stack_fffffffffffffe90);
          }
          else {
            in_stack_fffffffffffffe90 = "";
            if ((_i_1->hasPointers & 1U) != 0) {
              in_stack_fffffffffffffe90 = " gc_check";
            }
            in_stack_fffffffffffffe88 = CONCAT44(uVar15,_i_1->padding);
            Print((ExpressionGraphContext *)scope_local,
                  "%.*s: size(%d) align(%d) padding(%d)%s from %.*s\n",
                  (ulong)(uint)((int)(_i_1->name).end - (int)(_i_1->name).begin),(_i_1->name).begin,
                  _i_1->size & 0xffffffff,(ulong)_i_1->alignment,in_stack_fffffffffffffe88,
                  in_stack_fffffffffffffe90,
                  (int)(_i_1->importModule->name).end - (int)(_i_1->importModule->name).begin,
                  (_i_1->importModule->name).begin);
          }
        }
        else if (_i_1->importModule == (ModuleData *)0x0) {
          Print((ExpressionGraphContext *)scope_local,"%.*s: generic\n",
                (ulong)(uint)((int)(_i_1->name).end - (int)(_i_1->name).begin),(_i_1->name).begin);
        }
        else {
          Print((ExpressionGraphContext *)scope_local,"%.*s: generic from %.*s\n",
                (ulong)(uint)((int)(_i_1->name).end - (int)(_i_1->name).begin),(_i_1->name).begin,
                (ulong)(uint)((int)(_i_1->importModule->name).end -
                             (int)(_i_1->importModule->name).begin),(_i_1->importModule->name).begin
               );
        }
      }
    }
    PrintLeaveBlock((ExpressionGraphContext *)scope_local);
  }
  bVar2 = SmallArray<FunctionData_*,_2U>::empty(&pSStack_38->functions);
  if (!bVar2) {
    PrintEnterBlock((ExpressionGraphContext *)scope_local,"functions");
    for (data_1._0_4_ = 0; uVar4 = (uint)data_1,
        uVar3 = SmallArray<FunctionData_*,_2U>::size(&pSStack_38->functions), uVar4 < uVar3;
        data_1._0_4_ = (uint)data_1 + 1) {
      ppFVar7 = SmallArray<FunctionData_*,_2U>::operator[](&pSStack_38->functions,(uint)data_1);
      pSVar1 = scope_local;
      uVar15 = (undefined4)((ulong)in_stack_fffffffffffffe90 >> 0x20);
      pFStack_80 = *ppFVar7;
      local_81 = pFStack_80->importModule != (ModuleData *)0x0;
      if ((type._7_1_ & 1) == local_81) {
        InplaceStr::InplaceStr((InplaceStr *)auStack_98);
        in_stack_fffffffffffffe90 = (char *)CONCAT44(uVar15,pFStack_80->uniqueId);
        PrintIndented((ExpressionGraphContext *)pSVar1,pFStack_80->type,(TypeBase *)"%.*s: f%04x",
                      _auStack_98,local_90,
                      (ulong)(uint)((int)(pFStack_80->name->name).end -
                                   (int)(pFStack_80->name->name).begin),
                      (pFStack_80->name->name).begin,in_stack_fffffffffffffe90);
      }
    }
    PrintLeaveBlock((ExpressionGraphContext *)scope_local);
  }
  bVar2 = SmallArray<VariableData_*,_4U>::empty(&pSStack_38->variables);
  if (!bVar2) {
    PrintEnterBlock((ExpressionGraphContext *)scope_local,"variables");
    for (data_2._4_4_ = 0; uVar4 = data_2._4_4_,
        uVar3 = SmallArray<VariableData_*,_4U>::size(&pSStack_38->variables), uVar4 < uVar3;
        data_2._4_4_ = data_2._4_4_ + 1) {
      ppVVar8 = SmallArray<VariableData_*,_4U>::operator[](&pSStack_38->variables,data_2._4_4_);
      pSVar1 = scope_local;
      uVar15 = (undefined4)((ulong)in_stack_fffffffffffffe90 >> 0x20);
      pVStack_a8 = *ppVVar8;
      local_a9 = pVStack_a8->importModule != (ModuleData *)0x0;
      if ((type._7_1_ & 1) == local_a9) {
        InplaceStr::InplaceStr((InplaceStr *)auStack_c0);
        pcVar12 = "";
        if ((pVStack_a8->isReadonly & 1U) != 0) {
          pcVar12 = " readonly";
        }
        pcVar14 = "";
        if ((pVStack_a8->isReference & 1U) != 0) {
          pcVar14 = " reference";
        }
        pcVar13 = "";
        if ((pVStack_a8->usedAsExternal & 1U) != 0) {
          pcVar13 = " captured";
        }
        pcVar9 = "";
        if ((pVStack_a8->type->hasPointers & 1U) != 0) {
          pcVar9 = " gc_check";
        }
        in_stack_fffffffffffffe90 = (char *)CONCAT44(uVar15,pVStack_a8->uniqueId);
        PrintIndented((ExpressionGraphContext *)pSVar1,pVStack_a8->type,
                      (TypeBase *)"%.*s: v%04x @ 0x%x%s%s%s%s",_auStack_c0,local_b8,
                      (ulong)(uint)((int)(pVStack_a8->name->name).end -
                                   (int)(pVStack_a8->name->name).begin),
                      (pVStack_a8->name->name).begin,in_stack_fffffffffffffe90,pVStack_a8->offset,
                      pcVar12,pcVar14,pcVar13,pcVar9);
      }
    }
    PrintLeaveBlock((ExpressionGraphContext *)scope_local);
  }
  bVar2 = SmallArray<AliasData_*,_2U>::empty(&pSStack_38->aliases);
  if (!bVar2) {
    PrintEnterBlock((ExpressionGraphContext *)scope_local,"aliases");
    for (data_3._4_4_ = 0; uVar4 = data_3._4_4_,
        uVar3 = SmallArray<AliasData_*,_2U>::size(&pSStack_38->aliases), uVar4 < uVar3;
        data_3._4_4_ = data_3._4_4_ + 1) {
      ppAVar10 = SmallArray<AliasData_*,_2U>::operator[](&pSStack_38->aliases,data_3._4_4_);
      pSVar1 = scope_local;
      uVar15 = (undefined4)((ulong)in_stack_fffffffffffffe90 >> 0x20);
      pAStack_d0 = *ppAVar10;
      local_d1 = pAStack_d0->importModule != (ModuleData *)0x0;
      if ((type._7_1_ & 1) == local_d1) {
        InplaceStr::InplaceStr((InplaceStr *)auStack_e8,"typedef");
        in_stack_fffffffffffffe90 = (char *)CONCAT44(uVar15,pAStack_d0->uniqueId);
        PrintIndented((ExpressionGraphContext *)pSVar1,pAStack_d0->type,(TypeBase *)"%.*s: a%04x",
                      _auStack_e8,local_e0,
                      (ulong)(uint)((int)(pAStack_d0->name->name).end -
                                   (int)(pAStack_d0->name->name).begin),
                      (pAStack_d0->name->name).begin,in_stack_fffffffffffffe90);
      }
    }
    PrintLeaveBlock((ExpressionGraphContext *)scope_local);
  }
  bVar2 = SmallArray<ScopeData_*,_2U>::empty(&pSStack_38->scopes);
  if (!bVar2) {
    for (data_4._4_4_ = 0; uVar4 = SmallArray<ScopeData_*,_2U>::size(&pSStack_38->scopes),
        data_4._4_4_ < uVar4; data_4._4_4_ = data_4._4_4_ + 1) {
      ppSVar11 = SmallArray<ScopeData_*,_2U>::operator[](&pSStack_38->scopes,data_4._4_4_);
      pSVar1 = *ppSVar11;
      if (((pSVar1->ownerFunction == (FunctionData *)0x0) ||
          (pSVar1->ownerFunction->importModule == (ModuleData *)0x0)) &&
         (bVar2 = ContainsData(pSVar1,(bool)(type._7_1_ & 1)), bVar2)) {
        PrintGraph((ExpressionGraphContext *)scope_local,pSVar1,(bool)(type._7_1_ & 1));
      }
    }
  }
  *(int *)&scope_local->ownerNamespace = *(int *)&scope_local->ownerNamespace + -1;
  PrintIndent((ExpressionGraphContext *)scope_local);
  Print((ExpressionGraphContext *)scope_local,"}\n");
  return;
}

Assistant:

void PrintGraph(ExpressionGraphContext &ctx, ScopeData *scope, bool printImported)
{
	PrintIndent(ctx);

	const char *type = "";

	switch(scope->type)
	{
	case SCOPE_EXPLICIT:
		type = "SCOPE_EXPLICIT";
		break;
	case SCOPE_NAMESPACE:
		type = "SCOPE_NAMESPACE";
		break;
	case SCOPE_FUNCTION:
		type = "SCOPE_FUNCTION";
		break;
	case SCOPE_TYPE:
		type = "SCOPE_TYPE";
		break;
	case SCOPE_LOOP:
		type = "SCOPE_LOOP";
		break;
	case SCOPE_TEMPORARY:
		type = "SCOPE_TEMPORARY";
		break;
	default:
		assert(!"unknown type");
	}

	if(FunctionData *owner = scope->ownerFunction)
		Print(ctx, "ScopeData(%s, {%.*s: f%04x}: s%04x) @ 0x%x-0x%x {\n", type, FMT_ISTR(owner->name->name), owner->uniqueId, scope->uniqueId, unsigned(scope->startOffset), unsigned(scope->dataSize));
	else if(TypeBase *owner = scope->ownerType)
		Print(ctx, "ScopeData(%s, {%.*s}: s%04x){\n", type, FMT_ISTR(owner->name), scope->uniqueId);
	else if(NamespaceData *owner = scope->ownerNamespace)
		Print(ctx, "ScopeData(%s, {%.*s: n%04x}: s%04x){\n", type, FMT_ISTR(owner->name.name), owner->uniqueId, scope->uniqueId);
	else
		Print(ctx, "ScopeData(%s, {}: s%04x) @ 0x%x-0x%x {\n", type, scope->uniqueId, unsigned(scope->startOffset), unsigned(scope->dataSize));

	ctx.depth++;

	if(!scope->types.empty())
	{
		PrintEnterBlock(ctx, "types");

		for(unsigned i = 0; i < scope->types.size(); i++)
		{
			TypeBase *data = scope->types[i];

			bool imported = getType<TypeClass>(data) && getType<TypeClass>(data)->importModule != NULL;

			if(printImported != imported)
				continue;

			PrintIndent(ctx);

			if(data->isGeneric)
			{
				if(data->importModule)
					Print(ctx, "%.*s: generic from %.*s\n", FMT_ISTR(data->name), FMT_ISTR(data->importModule->name));
				else
					Print(ctx, "%.*s: generic\n", FMT_ISTR(data->name));
			}
			else
			{
				if(data->importModule)
					Print(ctx, "%.*s: size(%d) align(%d) padding(%d)%s from %.*s\n", FMT_ISTR(data->name), unsigned(data->size), data->alignment, data->padding, data->hasPointers ? " gc_check" : "", FMT_ISTR(data->importModule->name));
				else
					Print(ctx, "%.*s: size(%d) align(%d) padding(%d)%s\n", FMT_ISTR(data->name), unsigned(data->size), data->alignment, data->padding, data->hasPointers ? " gc_check" : "");
			}
		}

		PrintLeaveBlock(ctx);
	}

	if(!scope->functions.empty())
	{
		PrintEnterBlock(ctx, "functions");

		for(unsigned i = 0; i < scope->functions.size(); i++)
		{
			FunctionData *data = scope->functions[i];

			bool imported = data->importModule != NULL;

			if(printImported != imported)
				continue;

			PrintIndented(ctx, InplaceStr(), data->type, "%.*s: f%04x", FMT_ISTR(data->name->name), data->uniqueId);
		}

		PrintLeaveBlock(ctx);
	}

	if(!scope->variables.empty())
	{
		PrintEnterBlock(ctx, "variables");

		for(unsigned i = 0; i < scope->variables.size(); i++)
		{
			VariableData *data = scope->variables[i];

			bool imported = data->importModule != NULL;

			if(printImported != imported)
				continue;

			PrintIndented(ctx, InplaceStr(), data->type, "%.*s: v%04x @ 0x%x%s%s%s%s", FMT_ISTR(data->name->name), data->uniqueId, data->offset, data->isReadonly ? " readonly" : "", data->isReference ? " reference" : "", data->usedAsExternal ? " captured" : "", data->type->hasPointers ? " gc_check" : "");
		}

		PrintLeaveBlock(ctx);
	}

	if(!scope->aliases.empty())
	{
		PrintEnterBlock(ctx, "aliases");

		for(unsigned i = 0; i < scope->aliases.size(); i++)
		{
			AliasData *data = scope->aliases[i];

			bool imported = data->importModule != NULL;

			if(printImported != imported)
				continue;

			PrintIndented(ctx, InplaceStr("typedef"), data->type, "%.*s: a%04x", FMT_ISTR(data->name->name), data->uniqueId);
		}

		PrintLeaveBlock(ctx);
	}

	if(!scope->scopes.empty())
	{
		for(unsigned i = 0; i < scope->scopes.size(); i++)
		{
			ScopeData *data = scope->scopes[i];

			if(data->ownerFunction && data->ownerFunction->importModule != NULL)
				continue;

			if(ContainsData(data, printImported))
				PrintGraph(ctx, data, printImported);
		}
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, "}\n");
}